

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Syndicated_Data.cpp
# Opt level: O2

bool __thiscall
SRUP_MSG_SYNDICATED_DATA::DeSerialize(SRUP_MSG_SYNDICATED_DATA *this,uint8_t *serial_data)

{
  uint64_t *puVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  long lVar4;
  uint8_t (*pauVar5) [8];
  uint8_t *puVar6;
  uint uVar7;
  ulong uVar8;
  uint8_t bytes [2];
  uint8_t src_bytes [8];
  uint8_t snd_bytes [8];
  uint8_t sid_bytes [8];
  
  *(this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_version = *serial_data;
  *(this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_msgtype = serial_data[1];
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    sid_bytes[lVar4] = serial_data[lVar4 + 2];
  }
  puVar1 = (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_sequence_ID;
  if (puVar1 != (uint64_t *)0x0) {
    operator_delete(puVar1);
  }
  pauVar5 = (uint8_t (*) [8])operator_new(8);
  (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_sequence_ID = (uint64_t *)pauVar5;
  *pauVar5 = sid_bytes;
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    snd_bytes[lVar4] = serial_data[lVar4 + 10];
  }
  puVar1 = (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_sender_ID;
  if (puVar1 != (uint64_t *)0x0) {
    operator_delete(puVar1);
  }
  pauVar5 = (uint8_t (*) [8])operator_new(8);
  (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_sender_ID = (uint64_t *)pauVar5;
  *pauVar5 = snd_bytes;
  bytes = *(uint8_t (*) [2])(serial_data + 0x12);
  uVar2 = SRUP_MSG::decodeLength(bytes);
  puVar6 = (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_token;
  if (puVar6 != (uint8_t *)0x0) {
    operator_delete__(puVar6);
  }
  puVar6 = (uint8_t *)operator_new__((ulong)(uVar2 + 1));
  (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_token = puVar6;
  memcpy(puVar6,serial_data + 0x14,(ulong)uVar2);
  (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_token_len = uVar2;
  bytes = *(uint8_t (*) [2])(serial_data + (ulong)uVar2 + 0x14);
  uVar3 = SRUP_MSG::decodeLength(bytes);
  (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_sig_len = uVar3;
  puVar6 = (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_signature;
  if (puVar6 != (uint8_t *)0x0) {
    operator_delete__(puVar6);
  }
  uVar8 = (ulong)uVar3;
  puVar6 = (uint8_t *)operator_new__(uVar8);
  (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_signature = puVar6;
  memcpy(puVar6,serial_data + (uVar2 + 0x16),uVar8);
  lVar4 = (uVar2 + 0x16) + uVar8;
  bytes = *(uint8_t (*) [2])(serial_data + lVar4);
  uVar2 = SRUP_MSG::decodeLength(bytes);
  puVar6 = (this->super_SRUP_MSG_DATA).m_data_ID;
  if (puVar6 != (uint8_t *)0x0) {
    operator_delete__(puVar6);
  }
  puVar6 = (uint8_t *)operator_new__((ulong)(uVar2 + 1));
  (this->super_SRUP_MSG_DATA).m_data_ID = puVar6;
  uVar8 = (ulong)((int)lVar4 + 2);
  memcpy(puVar6,serial_data + uVar8,(ulong)uVar2);
  (this->super_SRUP_MSG_DATA).m_data_ID_len = uVar2;
  lVar4 = uVar8 + uVar2;
  bytes = *(uint8_t (*) [2])(serial_data + lVar4);
  uVar2 = SRUP_MSG::decodeLength(bytes);
  uVar7 = (int)lVar4 + 2;
  puVar6 = (this->super_SRUP_MSG_DATA).m_data;
  if (puVar6 != (uint8_t *)0x0) {
    operator_delete__(puVar6);
  }
  puVar6 = (uint8_t *)operator_new__((ulong)(uVar2 + 1));
  (this->super_SRUP_MSG_DATA).m_data = puVar6;
  memcpy(puVar6,serial_data + uVar7,(ulong)uVar2);
  (this->super_SRUP_MSG_DATA).m_data_len = uVar2;
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    src_bytes[lVar4] = serial_data[lVar4 + (ulong)(uVar7 + uVar2)];
  }
  operator_delete(this->m_source_ID);
  pauVar5 = (uint8_t (*) [8])operator_new(8);
  this->m_source_ID = (uint64_t *)pauVar5;
  *pauVar5 = src_bytes;
  return true;
}

Assistant:

bool SRUP_MSG_SYNDICATED_DATA::DeSerialize(const uint8_t *serial_data)
{
    uint16_t x;
    uint32_t p=0;
    uint8_t bytes[2];

    // We need to unmarshall the data to reconstruct the object...
    // We can start with the two bytes for the header.
    // One for the version - and one for the message type.

    std::memcpy(m_version, (uint8_t*) serial_data, 1);
    p+=1;
    std::memcpy(m_msgtype, (uint8_t*) serial_data + p, 1);
    p+=1;

    // Now we have to unmarshall the sequence ID...
    uint8_t sid_bytes[8];
    for (unsigned char & sid_byte : sid_bytes)
    {
        std::memcpy(&sid_byte, (uint8_t*) serial_data + p, 1);
        ++p;
    }

    // ... then we copy them into m_sequence_ID
    if (m_sequence_ID != nullptr)
        delete(m_sequence_ID);
    m_sequence_ID = new uint64_t;
    std::memcpy(m_sequence_ID, sid_bytes, 8);

    // Next we have to unmarshall the sender ID...
    uint8_t snd_bytes[8];
    for (unsigned char & snd_byte : snd_bytes)
    {
        std::memcpy(&snd_byte, (uint8_t*) serial_data + p, 1);
        ++p;
    }

    // ... then we copy them into the sender ID
    if (m_sender_ID != nullptr)
        delete(m_sender_ID);
    m_sender_ID = new uint64_t;
    std::memcpy(m_sender_ID, snd_bytes, 8);

    // Now we have two-bytes for the size of the token ... and x bytes for the token
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;
    delete[] m_token;
    m_token = new uint8_t[x+1];
    std::memcpy(m_token, (uint8_t *) serial_data + p, x);
    m_token_len = x;
    p+=x;

    // The next two bytes are the size of the signature...
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;

    m_sig_len = x;

    // The next x bytes are the value of the signature.
    delete[] m_signature;
    m_signature = new unsigned char[x];
    std::memcpy(m_signature, serial_data + p, x);

    p+=x;

    // Next the data_ID...
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;
    delete[] m_data_ID;
    m_data_ID = new uint8_t[x+1];
    std::memcpy(m_data_ID, (uint8_t *) serial_data + p, x);
    m_data_ID_len = x;
    p+=x;

    // ...and now the data
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;

    delete[] m_data;
    m_data = new uint8_t[x+1];
    std::memcpy(m_data, (uint8_t *) serial_data + p, x);
    m_data_len = x;
    p+=x;

    // And finally we have to unmarshall the source ID...
    uint8_t src_bytes[8];
    for (unsigned char & src_byte : src_bytes)
    {
        std::memcpy(&src_byte, (uint8_t*) serial_data + p, 1);
        ++p;
    }

    // ... then we copy them into the source ID
    delete(m_source_ID);
    m_source_ID = new uint64_t;
    std::memcpy(m_source_ID, src_bytes, 8);

    return true;
}